

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

_Bool sx_strequal(char *a,char *b)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar2 = sx_strlen(a);
  uVar3 = sx_strlen(b);
  if (uVar2 == uVar3) {
    bVar5 = (int)uVar2 < 1;
    if ((0 < (int)uVar2) && (*a == *b)) {
      uVar1 = 1;
      do {
        uVar4 = uVar1;
        if (uVar2 == uVar4) break;
        uVar1 = uVar4 + 1;
      } while (a[uVar4] == b[uVar4]);
      bVar5 = uVar2 <= uVar4;
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool sx_strequal(const char* SX_RESTRICT a, const char* SX_RESTRICT b)
{
    int alen = sx_strlen(a);
    int blen = sx_strlen(b);
    if (alen != blen)
        return false;

    for (int i = 0; i < alen; i++) {
        if (a[i] != b[i])
            return false;
    }
    return true;
}